

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_ae8::ndiPHINFHelper(ndicapi *pol,char *cp,char *crp)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 1;
  if (cp[5] == ' ') {
    cVar1 = cp[6];
  }
  else {
    if (cp[5] != ':') goto LAB_00108834;
    cVar1 = cp[10];
  }
  if (cVar1 != '\r') {
    uVar2 = ndiHexToUnsignedLong(cp + 8,4);
  }
LAB_00108834:
  cVar1 = *crp;
  pol->PhinfUnoccupied = (uint)(cVar1 == 'U') * 3;
  if ((uVar2 & 1) != 0) {
    if (cVar1 == 'U') {
      builtin_strncpy(pol->PhinfBasic,"00000000            0000000000000",0x21);
    }
    else {
      lVar3 = 0;
      do {
        if (crp[lVar3] < ' ') break;
        pol->PhinfBasic[lVar3] = crp[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 0x21);
      crp = crp + lVar3;
    }
  }
  if ((uVar2 & 2) != 0) {
    if (cVar1 == 'U') {
      builtin_strncpy(pol->PhinfTesting,"00000000",8);
    }
    else {
      lVar3 = 0;
      do {
        if (crp[lVar3] < ' ') break;
        pol->PhinfTesting[lVar3] = crp[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 8);
      crp = crp + lVar3;
    }
  }
  if ((uVar2 & 4) != 0) {
    if (cVar1 == 'U') {
      builtin_strncpy(pol->PhinfPartNumber,"                    ",0x14);
    }
    else {
      lVar3 = 0;
      do {
        if (crp[lVar3] < ' ') break;
        pol->PhinfPartNumber[lVar3] = crp[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 0x14);
      crp = crp + lVar3;
    }
  }
  if ((uVar2 & 8) != 0) {
    if (cVar1 == 'U') {
      pol->PhinfAccessories[0] = '0';
      pol->PhinfAccessories[1] = '0';
    }
    else {
      lVar3 = 0;
      do {
        if (crp[lVar3] < ' ') break;
        pol->PhinfAccessories[lVar3] = crp[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 == 1);
      crp = crp + lVar3;
    }
  }
  if ((uVar2 & 0x10) != 0) {
    if (cVar1 == 'U') {
      pol->PhinfMarkerType[0] = '0';
      pol->PhinfMarkerType[1] = '0';
    }
    else {
      lVar3 = 0;
      do {
        if (crp[lVar3] < ' ') break;
        pol->PhinfMarkerType[lVar3] = crp[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 == 1);
      crp = crp + lVar3;
    }
  }
  if ((uVar2 & 0x20) != 0) {
    if (cVar1 == 'U') {
      builtin_strncpy(pol->PhinfPortLocation,"00000000000000",0xe);
    }
    else {
      lVar3 = 0;
      do {
        if (crp[lVar3] < ' ') break;
        pol->PhinfPortLocation[lVar3] = crp[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 0xe);
      crp = crp + lVar3;
    }
  }
  if ((uVar2 & 0x40) != 0) {
    if (cVar1 == 'U') {
      pol->PhinfGpioStatus[0] = '0';
      pol->PhinfGpioStatus[1] = '0';
    }
    else {
      lVar3 = 0;
      do {
        if (crp[lVar3] < ' ') {
          return;
        }
        pol->PhinfGpioStatus[lVar3] = crp[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 == 1);
    }
  }
  return;
}

Assistant:

void ndiPHINFHelper(ndicapi* pol, const char* cp, const char* crp)
  {
    unsigned long mode = 0x0001; // the default reply mode
    char* dp;
    int j;
    int unoccupied = NDI_OKAY;

    // if the PHINF command had a reply mode, read it
    if ((cp[5] == ':' && cp[10] != '\r') || (cp[5] == ' ' && cp[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&cp[8], 4);
    }

    // check for unoccupied
    if (*crp == 'U')
    {
      unoccupied = NDI_UNOCCUPIED;
    }
    pol->PhinfUnoccupied = unoccupied;

    // fprintf(stderr, "mode = %04lx\n", mode);

    if (mode & NDI_BASIC)
    {
      dp = pol->PhinfBasic;
      if (!unoccupied)
      {
        for (j = 0; j < 33 && *crp >= ' '; j++)
        {
          // fprintf(stderr,"%c",*crp);
          *dp++ = *crp++;
        }
        // fprintf(stderr,"\n");
      }
      else    // default "00000000            0000000000000"
      {
        for (j = 0; j < 8; j++)
        {
          *dp++ = '0';
        }
        for (j = 0; j < 12; j++)
        {
          *dp++ = ' ';
        }
        for (j = 0; j < 13; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_TESTING)
    {
      dp = pol->PhinfTesting;
      if (!unoccupied)
      {
        for (j = 0; j < 8 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00000000"
      {
        for (j = 0; j < 8; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_PART_NUMBER)
    {
      dp = pol->PhinfPartNumber;
      if (!unoccupied)
      {
        for (j = 0; j < 20 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "                    "
      {
        for (j = 0; j < 20; j++)
        {
          *dp++ = ' ';
        }
      }
    }

    if (mode & NDI_ACCESSORIES)
    {
      dp = pol->PhinfAccessories;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_MARKER_TYPE)
    {
      dp = pol->PhinfMarkerType;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_PORT_LOCATION)
    {
      dp = pol->PhinfPortLocation;
      if (!unoccupied)
      {
        for (j = 0; j < 14 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00000000000000"
      {
        for (j = 0; j < 14; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_GPIO_STATUS)
    {
      dp = pol->PhinfGpioStatus;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }
  }